

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

void reset_hostility(monst *roamer)

{
  monst *roamer_local;
  
  if (((*(uint *)&roamer->field_0x60 >> 0x1a & 1) != 0) &&
     ((roamer->data == mons + 0x11f || (roamer->data == mons + 0x7f)))) {
    if (roamer->field_0x74 != u.ualign.type) {
      roamer->mtame = '\0';
      *(uint *)&roamer->field_0x60 = *(uint *)&roamer->field_0x60 & 0xffbfffff;
      set_malign(roamer);
    }
    newsym((int)roamer->mx,(int)roamer->my);
  }
  return;
}

Assistant:

void reset_hostility(struct monst *roamer)
{
	if (!(roamer->isminion && (roamer->data == &mons[PM_ALIGNED_PRIEST] ||
				  roamer->data == &mons[PM_ANGEL])))
	        return;

	if (EPRI(roamer)->shralign != u.ualign.type) {
	    roamer->mpeaceful = roamer->mtame = 0;
	    set_malign(roamer);
	}
	newsym(roamer->mx, roamer->my);
}